

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::requestFocus(WindowImplX11 *this)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  reference ppWVar5;
  ostream *poVar6;
  ulong *local_d8;
  XWMHints *hints;
  undefined1 local_c8 [7];
  bool windowViewable;
  XWindowAttributes attributes;
  __normal_iterator<sf::priv::WindowImplX11_**,_std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>_>
  local_30;
  __normal_iterator<sf::priv::WindowImplX11_**,_std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>_>
  local_28;
  iterator itr;
  Lock lock;
  bool sfmlWindowFocused;
  WindowImplX11 *this_local;
  
  bVar1 = false;
  Lock::Lock((Lock *)&itr,(Mutex *)&(anonymous_namespace)::allWindowsMutex);
  local_28._M_current =
       (WindowImplX11 **)
       std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>::begin
                 ((vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_> *)
                  (anonymous_namespace)::allWindows);
  do {
    local_30._M_current =
         (WindowImplX11 **)
         std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>::end
                   ((vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_> *
                    )(anonymous_namespace)::allWindows);
    bVar2 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar2) {
LAB_00134347:
      Lock::~Lock((Lock *)&itr);
      iVar4 = XGetWindowAttributes(this->m_display,this->m_window,local_c8);
      if (iVar4 == 0) {
        poVar6 = err();
        poVar6 = std::operator<<(poVar6,
                                 "Failed to check if window is viewable while requesting focus");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      else if ((bVar1) && (attributes.colormap._4_4_ == 2)) {
        grabFocus(this);
      }
      else {
        local_d8 = (ulong *)XGetWMHints(this->m_display,this->m_window);
        if (local_d8 == (ulong *)0x0) {
          local_d8 = (ulong *)XAllocWMHints();
        }
        *local_d8 = *local_d8 | 0x100;
        XSetWMHints(this->m_display,this->m_window,local_d8);
        XFree(local_d8);
      }
      return;
    }
    ppWVar5 = __gnu_cxx::
              __normal_iterator<sf::priv::WindowImplX11_**,_std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>_>
              ::operator*(&local_28);
    uVar3 = (*((*ppWVar5)->super_WindowImpl)._vptr_WindowImpl[0xf])();
    if ((uVar3 & 1) != 0) {
      bVar1 = true;
      goto LAB_00134347;
    }
    __gnu_cxx::
    __normal_iterator<sf::priv::WindowImplX11_**,_std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

void WindowImplX11::requestFocus()
{
    // Focus is only stolen among SFML windows, not between applications
    // Check the global list of windows to find out whether an SFML window has the focus
    // Note: can't handle console and other non-SFML windows belonging to the application.
    bool sfmlWindowFocused = false;

    {
        Lock lock(allWindowsMutex);
        for (std::vector<WindowImplX11*>::iterator itr = allWindows.begin(); itr != allWindows.end(); ++itr)
        {
            if ((*itr)->hasFocus())
            {
                sfmlWindowFocused = true;
                break;
            }
        }
    }

    // Check if window is viewable (not on other desktop, ...)
    // TODO: Check also if minimized
    XWindowAttributes attributes;
    if (XGetWindowAttributes(m_display, m_window, &attributes) == 0)
    {
        sf::err() << "Failed to check if window is viewable while requesting focus" << std::endl;
        return; // error getting attribute
    }

    bool windowViewable = (attributes.map_state == IsViewable);

    if (sfmlWindowFocused && windowViewable)
    {
        // Another SFML window of this application has the focus and the current window is viewable:
        // steal focus (i.e. bring window to the front and give it input focus)
        grabFocus();
    }
    else
    {
        // Otherwise: display urgency hint (flashing application logo)
        // Ensure WM hints exist, allocate if necessary
        XWMHints* hints = XGetWMHints(m_display, m_window);
        if (hints == NULL)
            hints = XAllocWMHints();

        // Add urgency (notification) flag to hints
        hints->flags |= XUrgencyHint;
        XSetWMHints(m_display, m_window, hints);
        XFree(hints);
    }
}